

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O2

void test_cpp_wrapper_get_lots(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  uint uVar1;
  int iVar2;
  
  cpp_wrapper_setup(tc,dict,ion_fill_none);
  iVar2 = 0x5dc;
  for (uVar1 = 300; uVar1 < 1000; uVar1 = uVar1 + 0xf) {
    cpp_wrapper_insert(tc,dict,uVar1,iVar2,'\x01');
    iVar2 = iVar2 + 0x4b;
  }
  iVar2 = 0x5dc;
  for (uVar1 = 300; uVar1 < 1000; uVar1 = uVar1 + 0xf) {
    cpp_wrapper_get(tc,dict,uVar1,iVar2,'\0',1);
    iVar2 = iVar2 + 0x4b;
  }
  return;
}

Assistant:

void
test_cpp_wrapper_get_lots(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		cpp_wrapper_insert(tc, dict, i, i * 5, boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		cpp_wrapper_get(tc, dict, i, i * 5, err_ok, 1);
	}
}